

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::AssemblyGrammar::lookupSpecConstantOpcode(AssemblyGrammar *this,Op opcode)

{
  spv_ext_inst_table_t *psVar1;
  ulong uVar2;
  
  uVar2 = 0x10;
  psVar1 = (spv_ext_inst_table_t *)&DAT_00952360;
  do {
    if (psVar1[-2].count == opcode) {
      psVar1 = psVar1 + -2;
      goto LAB_00622d80;
    }
    if (psVar1[-1].count == opcode) {
      psVar1 = psVar1 + -1;
      goto LAB_00622d80;
    }
    if (psVar1->count == opcode) goto LAB_00622d80;
    if (psVar1[1].count == opcode) {
      psVar1 = psVar1 + 1;
      goto LAB_00622d80;
    }
    uVar2 = uVar2 - 1;
    psVar1 = psVar1 + 4;
  } while (1 < uVar2);
  psVar1 = (spv_ext_inst_table_t *)
           (&DAT_00952700 + (ulong)(opcode != OpCooperativeMatrixLengthKHR) * 0x10);
LAB_00622d80:
  return (uint)(psVar1 != &kTable_1_0) * 9 + SPV_ERROR_INVALID_LOOKUP;
}

Assistant:

spv_result_t AssemblyGrammar::lookupSpecConstantOpcode(spv::Op opcode) const {
  const auto* last = kOpSpecConstantOpcodes + kNumOpSpecConstantOpcodes;
  const auto* found =
      std::find_if(kOpSpecConstantOpcodes, last,
                   [opcode](const SpecConstantOpcodeEntry& entry) {
                     return opcode == entry.opcode;
                   });
  if (found == last) return SPV_ERROR_INVALID_LOOKUP;
  return SPV_SUCCESS;
}